

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Inversion * __thiscall
OpenMD::SelectionManager::nextUnselectedInversion(SelectionManager *this,int *i)

{
  int iVar1;
  reference ppIVar2;
  int *in_RSI;
  OpenMDBitSet *in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  value_type pIVar3;
  
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
             &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,4);
  iVar1 = OpenMDBitSet::nextOffBit(in_RDI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  *in_RSI = iVar1;
  if (*in_RSI == -1) {
    pIVar3 = (value_type)0x0;
  }
  else {
    ppIVar2 = std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator[]
                        ((vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *)
                         &in_RDI[3].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,(long)*in_RSI);
    pIVar3 = *ppIVar2;
  }
  return pIVar3;
}

Assistant:

Inversion* SelectionManager::nextUnselectedInversion(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[INVERSION].size())) {
      if (!ss_.bitsets_[INVERSION][i]) {
        // check that this processor owns this inversion
        if (inversions_[i] != NULL) return inversions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[INVERSION].nextOffBit(i);
    return i == -1 ? NULL : inversions_[i];
#endif
  }